

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O1

OptError * multihash::decode(OptError *__return_storage_ptr__,string *str,Multihash *m)

{
  Multihash *in_RCX;
  Bytes buf;
  void *local_30 [2];
  long local_20;
  
  binary::decodeHex((Bytes *)local_30,str);
  decode_abi_cxx11_(__return_storage_ptr__,(multihash *)local_30,(Bytes *)m,in_RCX);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

OptError decode(std::string str, Multihash &m) {
	Bytes buf = binary::decodeHex(str);
	return decode(buf, m);
}